

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[5]>(XmlWriter *this,string *name,char (*attribute) [5])

{
  ulong uVar1;
  ostream *poVar2;
  char (*attribute_local) [5];
  string *name_local;
  XmlWriter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = stream(this);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    poVar2 = std::operator<<(poVar2,"=\"");
    poVar2 = std::operator<<(poVar2,*attribute);
    std::operator<<(poVar2,"\"");
  }
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            if( !name.empty() )
                stream() << " " << name << "=\"" << attribute << "\"";
            return *this;
        }